

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::UdpBodySyntax::setChild(UdpBodySyntax *this,size_t index,TokenOrSyntax child)

{
  SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax> *pSVar1;
  SyntaxNode *pSVar2;
  SyntaxList<slang::syntax::UdpEntrySyntax> *pSVar3;
  logic_error *this_00;
  Token TVar4;
  UdpInitialStmtSyntax *local_138;
  string local_110;
  allocator<char> local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined8 local_38;
  Info *local_30;
  undefined8 local_28;
  Info *local_20;
  size_t local_18;
  size_t index_local;
  UdpBodySyntax *this_local;
  
  local_18 = index;
  index_local = (size_t)this;
  switch(index) {
  case 0:
    pSVar2 = TokenOrSyntax::node(&child);
    pSVar1 = SyntaxNode::as<slang::syntax::SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax>>
                       (pSVar2);
    SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax>::operator=(&this->portDecls,pSVar1);
    break;
  case 1:
    pSVar2 = TokenOrSyntax::node(&child);
    if (pSVar2 == (SyntaxNode *)0x0) {
      local_138 = (UdpInitialStmtSyntax *)0x0;
    }
    else {
      pSVar2 = TokenOrSyntax::node(&child);
      local_138 = SyntaxNode::as<slang::syntax::UdpInitialStmtSyntax>(pSVar2);
    }
    this->initialStmt = local_138;
    break;
  case 2:
    TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_28 = TVar4._0_8_;
    (this->table).kind = (undefined2)local_28;
    (this->table).field_0x2 = local_28._2_1_;
    (this->table).numFlags = (NumericTokenFlags)local_28._3_1_;
    (this->table).rawLen = local_28._4_4_;
    local_20 = TVar4.info;
    (this->table).info = local_20;
    break;
  case 3:
    pSVar2 = TokenOrSyntax::node(&child);
    pSVar3 = SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::UdpEntrySyntax>>(pSVar2);
    SyntaxList<slang::syntax::UdpEntrySyntax>::operator=(&this->entries,pSVar3);
    break;
  case 4:
    TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_38 = TVar4._0_8_;
    (this->endtable).kind = (undefined2)local_38;
    (this->endtable).field_0x2 = local_38._2_1_;
    (this->endtable).numFlags = (NumericTokenFlags)local_38._3_1_;
    (this->endtable).rawLen = local_38._4_4_;
    local_30 = TVar4.info;
    (this->endtable).info = local_30;
    break;
  default:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O0/extern/slang/source/AllSyntax.cpp"
               ,&local_d9);
    std::operator+(&local_b8,&local_d8,":");
    std::__cxx11::to_string(&local_110,0x3358);
    std::operator+(&local_98,&local_b8,&local_110);
    std::operator+(&local_78,&local_98,": ");
    std::operator+(&local_58,&local_78,"Default case should be unreachable!");
    std::logic_error::logic_error(this_00,(string *)&local_58);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return;
}

Assistant:

void UdpBodySyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: portDecls = child.node()->as<SeparatedSyntaxList<UdpPortDeclSyntax>>(); return;
        case 1: initialStmt = child.node() ? &child.node()->as<UdpInitialStmtSyntax>() : nullptr; return;
        case 2: table = child.token(); return;
        case 3: entries = child.node()->as<SyntaxList<UdpEntrySyntax>>(); return;
        case 4: endtable = child.token(); return;
        default: ASSUME_UNREACHABLE;
    }
}